

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

float __thiscall Rml::Element::GetScrollHeight(Element *this)

{
  Vector2f VVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (this->scrollable_overflow_rectangle).y;
  VVar1 = Box::GetSize(&this->main_box,Padding);
  fVar2 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
  fVar2 = VVar1.y - fVar2;
  if (fVar3 <= fVar2) {
    fVar3 = fVar2;
  }
  return fVar3;
}

Assistant:

float Element::GetScrollHeight()
{
	return Math::Max(scrollable_overflow_rectangle.y, GetClientHeight());
}